

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode pausewrite(Curl_easy *data,int type,char *ptr,size_t len)

{
  bool bVar1;
  CURLcode CVar2;
  uint local_44;
  _Bool newtype;
  uint i;
  UrlState *s;
  SingleRequest *k;
  size_t len_local;
  char *ptr_local;
  int type_local;
  Curl_easy *data_local;
  
  bVar1 = true;
  Curl_http2_stream_pause(data,true);
  if ((data->state).tempcount == 0) {
    local_44 = 0;
  }
  else {
    for (local_44 = 0; local_44 < (data->state).tempcount; local_44 = local_44 + 1) {
      if ((data->state).tempwrite[local_44].type == type) {
        bVar1 = false;
        break;
      }
    }
    if (2 < local_44) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if (bVar1) {
    Curl_dyn_init(&(data->state).tempwrite[local_44].b,0x4000000);
    (data->state).tempwrite[local_44].type = type;
    (data->state).tempcount = (data->state).tempcount + 1;
  }
  CVar2 = Curl_dyn_addn(&(data->state).tempwrite[local_44].b,ptr,len);
  if (CVar2 == CURLE_OK) {
    (data->req).keepon = (data->req).keepon | 0x10;
    data_local._4_4_ = CURLE_OK;
  }
  else {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pausewrite(struct Curl_easy *data,
                           int type, /* what type of data */
                           const char *ptr,
                           size_t len)
{
  /* signalled to pause sending on this connection, but since we have data
     we want to send we need to dup it to save a copy for when the sending
     is again enabled */
  struct SingleRequest *k = &data->req;
  struct UrlState *s = &data->state;
  unsigned int i;
  bool newtype = TRUE;

  /* If this transfers over HTTP/2, pause the stream! */
  Curl_http2_stream_pause(data, TRUE);

  if(s->tempcount) {
    for(i = 0; i< s->tempcount; i++) {
      if(s->tempwrite[i].type == type) {
        /* data for this type exists */
        newtype = FALSE;
        break;
      }
    }
    DEBUGASSERT(i < 3);
    if(i >= 3)
      /* There are more types to store than what fits: very bad */
      return CURLE_OUT_OF_MEMORY;
  }
  else
    i = 0;

  if(newtype) {
    /* store this information in the state struct for later use */
    Curl_dyn_init(&s->tempwrite[i].b, DYN_PAUSE_BUFFER);
    s->tempwrite[i].type = type;
    s->tempcount++;
  }

  if(Curl_dyn_addn(&s->tempwrite[i].b, (unsigned char *)ptr, len))
    return CURLE_OUT_OF_MEMORY;

  /* mark the connection as RECV paused */
  k->keepon |= KEEP_RECV_PAUSE;

  return CURLE_OK;
}